

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

Element_p __thiscall indigox::Atom::GetElement(Atom *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<indigox::Element> *in_RSI;
  element_type *in_RDI;
  Element_p EVar1;
  
  std::shared_ptr<indigox::Element>::shared_ptr(in_RSI,(shared_ptr<indigox::Element> *)in_RDI);
  EVar1.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Element_p)EVar1.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element_p Atom::GetElement() const { return element_; }